

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O0

void __thiscall FPalette::MakeGoodRemap(FPalette *this)

{
  uint32 uVar1;
  uint32 uVar2;
  PalEntry *local_438;
  uint local_420;
  uint local_41c;
  int dup;
  int new0;
  PalEntry sortcopy [256];
  int i;
  PalEntry color0;
  FPalette *this_local;
  
  sortcopy[0xff].field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       *(anon_union_4_2_12391d7c_for_PalEntry_0 *)&this->BaseColors[0].field_0.field_0;
  sortcopy[0xfe].field_0 =
       (anon_union_4_2_12391d7c_for_PalEntry_0)
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x1;
  do {
    if (0xff < (int)sortcopy[0xfe].field_0) {
LAB_0066d490:
      if (this->Remap[0] == '\0') {
        local_438 = (PalEntry *)&dup;
        do {
          PalEntry::PalEntry(local_438);
          local_438 = local_438 + 1;
        } while (local_438 != sortcopy + 0xfe);
        for (sortcopy[0xfe].field_0 =
                  (anon_union_4_2_12391d7c_for_PalEntry_0)
                  (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0x0;
            (int)sortcopy[0xfe].field_0 < 0x100;
            sortcopy[0xfe].field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)((int)sortcopy[0xfe].field_0 + 1)) {
          uVar1 = PalEntry::operator_cast_to_unsigned_int
                            (this->BaseColors + (int)sortcopy[0xfe].field_0);
          PalEntry::operator=((PalEntry *)(&dup + (int)sortcopy[0xfe].field_0),
                              uVar1 | (int)sortcopy[0xfe].field_0 << 0x18);
        }
        qsort(&dup,0x100,4,sortforremap);
        for (sortcopy[0xfe].field_0 =
                  (anon_union_4_2_12391d7c_for_PalEntry_0)
                  (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)0xff;
            0 < (int)sortcopy[0xfe].field_0;
            sortcopy[0xfe].field_0 =
                 (anon_union_4_2_12391d7c_for_PalEntry_0)((int)sortcopy[0xfe].field_0 - 1)) {
          uVar1 = PalEntry::operator_cast_to_unsigned_int
                            ((PalEntry *)(&dup + (int)sortcopy[0xfe].field_0));
          uVar2 = PalEntry::operator_cast_to_unsigned_int
                            ((PalEntry *)(&dup + ((int)sortcopy[0xfe].field_0 + -1)));
          if ((uVar1 & 0xffffff) == (uVar2 & 0xffffff)) {
            local_41c = (uint)*(byte *)((long)&dup + (long)(int)sortcopy[0xfe].field_0 * 4 + 3);
            local_420 = (uint)*(byte *)((long)&dup +
                                       (long)((int)sortcopy[0xfe].field_0 + -1) * 4 + 3);
            if (local_420 < local_41c) {
              swapvalues<int>((int *)&local_41c,(int *)&local_420);
            }
            this->Remap[0] = (BYTE)local_41c;
            this->Remap[(int)local_41c] = (BYTE)local_420;
            this->BaseColors[(int)local_41c].field_0.field_0 =
                 (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
                 sortcopy[0xff].field_0;
            return;
          }
        }
      }
      return;
    }
    uVar1 = PalEntry::operator_cast_to_unsigned_int(this->BaseColors + (int)sortcopy[0xfe].field_0);
    uVar2 = PalEntry::operator_cast_to_unsigned_int(sortcopy + 0xff);
    if (uVar1 == uVar2) {
      this->Remap[0] = sortcopy[0xfe].field_0._0_1_;
      goto LAB_0066d490;
    }
    sortcopy[0xfe].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)((int)sortcopy[0xfe].field_0 + 1);
  } while( true );
}

Assistant:

void FPalette::MakeGoodRemap ()
{
	PalEntry color0 = BaseColors[0];
	int i;

	// First try for an exact match of color 0. Only Hexen does not have one.
	for (i = 1; i < 256; ++i)
	{
		if (BaseColors[i] == color0)
		{
			Remap[0] = i;
			break;
		}
	}

	// If there is no duplicate of color 0, find the first set of duplicate
	// colors and make one of them a duplicate of color 0. In Hexen's PLAYPAL
	// colors 209 and 229 are the only duplicates, but we cannot assume
	// anything because the player might be using a custom PLAYPAL where those
	// entries are not duplicates.
	if (Remap[0] == 0)
	{
		PalEntry sortcopy[256];

		for (i = 0; i < 256; ++i)
		{
			sortcopy[i] = BaseColors[i] | (i << 24);
		}
		qsort (sortcopy, 256, 4, sortforremap);
		for (i = 255; i > 0; --i)
		{
			if ((sortcopy[i] & 0xFFFFFF) == (sortcopy[i-1] & 0xFFFFFF))
			{
				int new0 = sortcopy[i].a;
				int dup = sortcopy[i-1].a;
				if (new0 > dup)
				{
					// Make the lower-numbered entry a copy of color 0. (Just because.)
					swapvalues (new0, dup);
				}
				Remap[0] = new0;
				Remap[new0] = dup;
				BaseColors[new0] = color0;
				break;
			}
		}
	}

	// If there were no duplicates, InitPalette() will remap color 0 to the
	// closest matching color. Hopefully nobody will use a palette where all
	// 256 entries are different. :-)
}